

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<float>_>::ClassId(TPZMatrix<Fad<float>_> *this)

{
  uint uVar1;
  type tVar2;
  uint uVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZMatrix",&local_39);
  uVar1 = Hash(&local_38);
  tVar2 = ClassIdOrHash<Fad<float>>();
  uVar3 = TPZBaseMatrix::ClassId(&this->super_TPZBaseMatrix);
  std::__cxx11::string::~string((string *)&local_38);
  return tVar2 * 2 ^ uVar1 ^ uVar3;
}

Assistant:

int TPZMatrix<TVar>::ClassId() const{
    return Hash("TPZMatrix") ^ ClassIdOrHash<TVar>()<<1 ^ TPZBaseMatrix::ClassId();
}